

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O1

int make_streamsInfo(archive_write *a,uint64_t offset,uint64_t pack_size,uint64_t unpack_size,
                    int num_coder,coder *coders,int substrm,uint32_t header_crc)

{
  coder *coders_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ssize_t sVar7;
  uchar *p;
  long lVar8;
  undefined4 in_register_00000084;
  uint uVar9;
  ulong uVar10;
  ulong unaff_R15;
  bool bVar11;
  uint8_t codec_buff [8];
  uint8_t crc [4];
  char local_58 [5];
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  int local_50;
  int local_4c;
  void *local_48;
  uint64_t local_40;
  int local_34;
  
  local_50 = (int)coders;
  coders_00 = (coder *)CONCAT44(in_register_00000084,num_coder);
  local_48 = a->format_data;
  iVar5 = 1;
  if (*(int *)CONCAT44(in_register_00000084,num_coder) == 0) {
    iVar5 = *(int *)((long)local_48 + 0x20);
  }
  local_40 = unpack_size;
  uVar2 = enc_uint64(a,6);
  if ((-1 < (int)uVar2) && (uVar2 = enc_uint64(a,offset), -1 < (int)uVar2)) {
    uVar2 = enc_uint64(a,(long)iVar5);
    if ((-1 < (int)uVar2) && (uVar2 = enc_uint64(a,9), -1 < (int)uVar2)) {
      if (iVar5 < 2) {
        uVar2 = enc_uint64(a,pack_size);
        unaff_R15 = (ulong)uVar2;
        if ((int)uVar2 < 0) {
          return uVar2;
        }
      }
      else {
        lVar8 = *(long *)((long)local_48 + 0xf110);
        bVar11 = true;
        if (lVar8 != 0) {
          do {
            if (*(uint64_t *)(lVar8 + 0x30) == 0) break;
            uVar2 = enc_uint64(a,*(uint64_t *)(lVar8 + 0x30));
            if ((int)uVar2 < 0) {
              unaff_R15 = (ulong)uVar2;
              bVar11 = false;
              goto LAB_00194287;
            }
            lVar8 = *(long *)(lVar8 + 0x18);
          } while (lVar8 != 0);
          bVar11 = true;
        }
LAB_00194287:
        if (!bVar11) {
          return (int)unaff_R15;
        }
      }
      iVar4 = (int)unaff_R15;
      uVar2 = enc_uint64(a,0);
      if ((((-1 < (int)uVar2) && (uVar2 = enc_uint64(a,7), -1 < (int)uVar2)) &&
          (uVar2 = enc_uint64(a,0xb), -1 < (int)uVar2)) &&
         ((uVar2 = enc_uint64(a,(long)iVar5), -1 < (int)uVar2 &&
          (uVar2 = enc_uint64(a,0), -1 < (int)uVar2)))) {
        if (0 < iVar5) {
          iVar3 = 0;
          do {
            local_4c = iVar3;
            iVar4 = enc_uint64(a,1);
            if (iVar4 < 0) {
              return iVar4;
            }
            bVar11 = true;
            while (iVar4 = (int)unaff_R15, bVar11) {
              uVar2 = coders_00->codec;
              local_58[0] = '\0';
              local_58[1] = '\0';
              local_58[2] = '\0';
              local_58[3] = '\0';
              local_58[4] = (char)(uVar2 >> 0x18);
              local_53 = (char)(uVar2 >> 0x10);
              local_52 = (char)(uVar2 >> 8);
              local_51 = (char)uVar2;
              uVar10 = 9;
              pcVar6 = local_58;
              do {
                if (*pcVar6 != '\0') {
                  iVar4 = (int)uVar10 + -1;
                  goto LAB_00194367;
                }
                uVar10 = uVar10 - 1;
                pcVar6 = pcVar6 + 1;
              } while (1 < uVar10);
              iVar4 = 0;
LAB_00194367:
              uVar9 = iVar4 + (uint)(iVar4 == 0);
              uVar2 = uVar9 | 0x20;
              if (coders_00->prop_size == 0) {
                uVar2 = uVar9;
              }
              uVar2 = enc_uint64(a,(long)(int)uVar2);
              if ((int)uVar2 < 0) {
LAB_001943e5:
                bVar1 = false;
                unaff_R15 = (ulong)uVar2;
              }
              else {
                uVar10 = compress_out(a,local_58 + (int)(8 - (uVar9 & 0xf)),(ulong)(uVar9 & 0xf),
                                      ARCHIVE_Z_RUN);
                if ((int)uVar10 < 0) {
LAB_001943ec:
                  bVar1 = false;
                  unaff_R15 = uVar10 & 0xffffffff;
                }
                else {
                  if (coders_00->prop_size != 0) {
                    uVar2 = enc_uint64(a,coders_00->prop_size);
                    if ((int)uVar2 < 0) goto LAB_001943e5;
                    uVar10 = compress_out(a,coders_00->props,coders_00->prop_size,ARCHIVE_Z_RUN);
                    if ((int)uVar10 < 0) goto LAB_001943ec;
                  }
                  bVar1 = true;
                }
              }
              bVar11 = false;
              if (!bVar1) {
                return (int)unaff_R15;
              }
            }
            iVar3 = local_4c + 1;
          } while (iVar3 != iVar5);
        }
        uVar2 = enc_uint64(a,0xc);
        if (-1 < (int)uVar2) {
          if (iVar5 < 2) {
            iVar5 = enc_uint64(a,local_40);
            if (iVar5 < 0) {
              return iVar5;
            }
          }
          else {
            lVar8 = *(long *)((long)local_48 + 0xf110);
            bVar11 = true;
            while( true ) {
              if ((lVar8 == 0) || (*(uint64_t *)(lVar8 + 0x30) == 0)) goto LAB_00194476;
              iVar5 = enc_uint64(a,*(uint64_t *)(lVar8 + 0x30));
              if (iVar5 < 0) break;
              lVar8 = *(long *)(lVar8 + 0x18);
            }
            bVar11 = false;
            iVar4 = iVar5;
LAB_00194476:
            if (!bVar11) {
              return iVar4;
            }
          }
          if (local_50 == 0) {
            iVar5 = enc_uint64(a,10);
            if ((iVar5 < 0) || (iVar5 = enc_uint64(a,1), iVar5 < 0)) {
              bVar11 = false;
            }
            else {
              local_34 = substrm;
              sVar7 = compress_out(a,&local_34,4,ARCHIVE_Z_RUN);
              bVar11 = -1 < (int)sVar7;
              iVar5 = iVar4;
              if (!bVar11) {
                iVar5 = (int)sVar7;
              }
            }
            if (!bVar11) {
              return iVar5;
            }
          }
          uVar2 = enc_uint64(a,0);
          if ((-1 < (int)uVar2) &&
             ((local_50 == 0 || (uVar2 = make_substreamsInfo(a,coders_00), -1 < (int)uVar2)))) {
            uVar2 = enc_uint64(a,0);
            uVar2 = (int)uVar2 >> 0x1f & uVar2;
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int
make_streamsInfo(struct archive_write *a, uint64_t offset, uint64_t pack_size,
    uint64_t unpack_size, int num_coder, struct coder *coders, int substrm,
    uint32_t header_crc)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	uint8_t codec_buff[8];
	int numFolders, fi;
	int codec_size;
	int i, r;

	if (coders->codec == _7Z_COPY)
		numFolders = (int)zip->total_number_nonempty_entry;
	else
		numFolders = 1;

	/*
	 * Make PackInfo.
	 */
	r = enc_uint64(a, kPackInfo);
	if (r < 0)
		return (r);

	/* Write PackPos. */
	r = enc_uint64(a, offset);
	if (r < 0)
		return (r);

	/* Write NumPackStreams. */
	r = enc_uint64(a, numFolders);
	if (r < 0)
		return (r);

	/* Make Size. */
	r = enc_uint64(a, kSize);
	if (r < 0)
		return (r);

	if (numFolders > 1) {
		struct file *file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}
	} else {
		/* Write size. */
		r = enc_uint64(a, pack_size);
		if (r < 0)
			return (r);
	}

	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	/*
	 * Make UnPackInfo.
	 */
	r = enc_uint64(a, kUnPackInfo);
	if (r < 0)
		return (r);

	/*
	 * Make Folder.
	 */
	r = enc_uint64(a, kFolder);
	if (r < 0)
		return (r);

	/* Write NumFolders. */
	r = enc_uint64(a, numFolders);
	if (r < 0)
		return (r);

	/* Write External. */
	r = enc_uint64(a, 0);
	if (r < 0)
		return (r);

	for (fi = 0; fi < numFolders; fi++) {
		/* Write NumCoders. */
		r = enc_uint64(a, num_coder);
		if (r < 0)
			return (r);

		for (i = 0; i < num_coder; i++) {
			unsigned codec_id = coders[i].codec;

			/* Write Codec flag. */
			archive_be64enc(codec_buff, codec_id);
			for (codec_size = 8; codec_size > 0; codec_size--) {
				if (codec_buff[8 - codec_size])
					break;
			}
			if (codec_size == 0)
				codec_size = 1;
			if (coders[i].prop_size)
				r = enc_uint64(a, codec_size | 0x20);
			else
				r = enc_uint64(a, codec_size);
			if (r < 0)
				return (r);

			/* Write Codec ID. */
			codec_size &= 0x0f;
			r = (int)compress_out(a, &codec_buff[8-codec_size],
				codec_size, ARCHIVE_Z_RUN);
			if (r < 0)
				return (r);

			if (coders[i].prop_size) {
				/* Write Codec property size. */
				r = enc_uint64(a, coders[i].prop_size);
				if (r < 0)
					return (r);

				/* Write Codec properties. */
				r = (int)compress_out(a, coders[i].props,
					coders[i].prop_size, ARCHIVE_Z_RUN);
				if (r < 0)
					return (r);
			}
		}
	}

	/*
	 * Make CodersUnPackSize.
	 */
	r = enc_uint64(a, kCodersUnPackSize);
	if (r < 0)
		return (r);

	if (numFolders > 1) {
		struct file *file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}

	} else {
		/* Write UnPackSize. */
		r = enc_uint64(a, unpack_size);
		if (r < 0)
			return (r);
	}

	if (!substrm) {
		uint8_t crc[4];
		/*
		 * Make CRC.
		 */
		r = enc_uint64(a, kCRC);
		if (r < 0)
			return (r);

		/* All are defined */
		r = enc_uint64(a, 1);
		if (r < 0)
			return (r);
		archive_le32enc(crc, header_crc);
		r = (int)compress_out(a, crc, 4, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	if (substrm) {
		/*
		 * Make SubStreamsInfo.
		 */
		r = make_substreamsInfo(a, coders);
		if (r < 0)
			return (r);
	}


	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	return (ARCHIVE_OK);
}